

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastBS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort *puVar1;
  char *pcVar2;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  uint uVar3;
  ulong uVar4;
  ParseContext *ctx_00;
  ulong hasbits_00;
  ParseContext *ctx_01;
  uint *puVar5;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  ctx_01 = (ParseContext *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)ctx_01 & 7) != 0) {
    AlignFail(ctx_01);
  }
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  if ((Arena *)arena.data == (Arena *)0x0) {
    puVar1 = (ushort *)
             anon_unknown_105::ReadStringNoArena
                       ((MessageLite *)(ptr + 1),(char *)ctx,ctx_01,0,table,
                        (ArenaStringPtr *)hasbits);
  }
  else {
    puVar1 = (ushort *)
             EpsCopyInputStream::ReadArenaString
                       (&ctx->super_EpsCopyInputStream,ptr + 1,(ArenaStringPtr *)ctx_01,
                        (Arena *)arena);
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (puVar1 == (ushort *)0x0) {
    anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)ctx_01);
    pcVar2 = Error(msg,(char *)ctx_01,ctx_00,(TcFieldData)arena,table,hasbits_00);
    return pcVar2;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar1) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar5 & 3) != 0) {
        AlignFail(puVar5);
      }
      *puVar5 = *puVar5 | (uint)hasbits_00;
    }
    return (char *)puVar1;
  }
  uVar3 = (uint)table->fast_idx_mask & (uint)*puVar1;
  if ((uVar3 & 7) == 0) {
    uVar4 = (ulong)(uVar3 & 0xfffffff8);
    pcVar2 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar1,ctx,
                                (ulong)*puVar1 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,hasbits_00);
    return pcVar2;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, ArenaStringPtr, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}